

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::add(Dictionary *this,string *w)

{
  int64_t *piVar1;
  int iVar2;
  int32_t iVar3;
  long lVar4;
  entry e;
  value_type local_68;
  
  iVar3 = find(this,w);
  this->ntokens_ = this->ntokens_ + 1;
  lVar4 = (long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3];
  if (lVar4 == -1) {
    local_68.word._M_dataplus._M_p = (pointer)&local_68.word.field_2;
    local_68.word._M_string_length = 0;
    local_68.word.field_2._M_local_buf[0] = '\0';
    local_68.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::__cxx11::string::_M_assign((string *)&local_68);
    local_68.count = 1;
    local_68.type = getType(this,w);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              (&this->words_,&local_68);
    iVar2 = this->size_;
    this->size_ = iVar2 + 1;
    (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar3] = iVar2;
    entry::~entry(&local_68);
  }
  else {
    piVar1 = &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar4].count;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

void Dictionary::add(const std::string& w) {
  int32_t h = find(w);
  ntokens_++;
  if (word2int_[h] == -1) {
    entry e;
    e.word = w;
    e.count = 1;
    e.type = getType(w);
    words_.push_back(e);
    word2int_[h] = size_++;
  } else {
    words_[word2int_[h]].count++;
  }
}